

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryCase::iterate
          (PrimitivesGeneratedQueryCase *this)

{
  ostringstream *poVar1;
  TestContext *this_00;
  int iVar2;
  undefined4 uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int iVar7;
  GLuint primitivesGenerated;
  Query query;
  Buffer buffer;
  VertexArray vao;
  int local_1d4;
  ObjectWrapper local_1d0;
  ObjectWrapper local_1b8;
  undefined1 local_1a0 [384];
  long lVar5;
  
  local_1d4 = -0x21452453;
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing 8 points, setting a_one for each to value (1.0, 1.0, 1.0, 1.0)",0x46);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  if ((anonymous_namespace)::PrimitivesGeneratedQueryCase::iterate()::vertexData == '\0') {
    _GLOBAL__N_1::PrimitivesGeneratedQueryCase::iterate();
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_1a0,(Functions *)CONCAT44(extraout_var_00,iVar2),pOVar6);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1b8,(Functions *)CONCAT44(extraout_var_01,iVar2),pOVar6);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper(&local_1d0,(Functions *)CONCAT44(extraout_var_02,iVar2),pOVar6);
  uVar3 = (**(code **)(lVar5 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar2 = (**(code **)(lVar5 + 0x780))((this->m_program->m_program).m_program,"a_one");
  (**(code **)(lVar5 + 0xd8))(local_1a0._16_4_);
  (**(code **)(lVar5 + 0x40))(0x8892,local_1b8.m_object);
  (**(code **)(lVar5 + 0x150))(0x8892,0x100,iterate::vertexData,0x88e4);
  (**(code **)(lVar5 + 0x19f0))(uVar3,4,0x1406,0,0x20,0);
  (**(code **)(lVar5 + 0x610))(uVar3);
  if (iVar2 != -1) {
    (**(code **)(lVar5 + 0x19f0))(iVar2,4,0x1406,0,0x20,0x10);
    (**(code **)(lVar5 + 0x610))(iVar2);
  }
  (**(code **)(lVar5 + 0x1680))((this->m_program->m_program).m_program);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"setup render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1288);
  (**(code **)(lVar5 + 0x20))(0x8c87,local_1d0.m_object);
  (**(code **)(lVar5 + 0x538))(0,0,8);
  (**(code **)(lVar5 + 0x628))(0x8c87);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"render and query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x128e);
  (**(code **)(lVar5 + 0xa20))(local_1d0.m_object,0x8866,&local_1d4);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"get query result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1291);
  glu::ObjectWrapper::~ObjectWrapper(&local_1d0);
  glu::ObjectWrapper::~ObjectWrapper(&local_1b8);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1a0);
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_PRIMITIVES_GENERATED = ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  iVar2 = 8;
  if (this->m_test == TEST_INSTANCED) {
    iVar2 = 0x20;
  }
  iVar7 = 0x18;
  if (this->m_test != TEST_AMPLIFICATION) {
    iVar7 = iVar2;
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (iVar7 == local_1d4) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              (this_00,QP_TEST_RESULT_FAIL,"got wrong result for GL_PRIMITIVES_GENERATED");
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Got unexpected result for GL_PRIMITIVES_GENERATED. Expected ",0x3c
              );
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  }
  return STOP;
}

Assistant:

PrimitivesGeneratedQueryCase::IterateResult PrimitivesGeneratedQueryCase::iterate (void)
{
	glw::GLuint primitivesGenerated = 0xDEBADBAD;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Drawing 8 points, setting a_one for each to value (1.0, 1.0, 1.0, 1.0)"
		<< tcu::TestLog::EndMessage;

	{
		static const tcu::Vec4 vertexData[8*2] =
		{
			tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.1f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.2f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.3f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.4f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.6f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.7f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		};

		const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
		const glu::VertexArray	vao					(m_context.getRenderContext());
		const glu::Buffer		buffer				(m_context.getRenderContext());
		const glu::Query		query				(m_context.getRenderContext());
		const int				positionLocation	= gl.getAttribLocation(m_program->getProgram(), "a_position");
		const int				oneLocation			= gl.getAttribLocation(m_program->getProgram(), "a_one");

		gl.bindVertexArray(*vao);

		gl.bindBuffer(GL_ARRAY_BUFFER, *buffer);
		gl.bufferData(GL_ARRAY_BUFFER, (int)sizeof(vertexData), vertexData, GL_STATIC_DRAW);

		gl.vertexAttribPointer(positionLocation, 4, GL_FLOAT, GL_FALSE, 2 * (int)sizeof(tcu::Vec4), DE_NULL);
		gl.enableVertexAttribArray(positionLocation);

		if (oneLocation != -1)
		{
			gl.vertexAttribPointer(oneLocation, 4, GL_FLOAT, GL_FALSE, 2 * (int)sizeof(tcu::Vec4), (const tcu::Vec4*)DE_NULL + 1);
			gl.enableVertexAttribArray(oneLocation);
		}

		gl.useProgram(m_program->getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "setup render");

		gl.beginQuery(GL_PRIMITIVES_GENERATED, *query);
		gl.drawArrays(GL_POINTS, 0, 8);
		gl.endQuery(GL_PRIMITIVES_GENERATED);

		GLU_EXPECT_NO_ERROR(gl.getError(), "render and query");

		gl.getQueryObjectuiv(*query, GL_QUERY_RESULT, &primitivesGenerated);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get query result");
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_PRIMITIVES_GENERATED = " << primitivesGenerated
		<< tcu::TestLog::EndMessage;

	{
		const deUint32 expectedGenerated = (m_test == TEST_AMPLIFICATION) ? (3*8) : (m_test == TEST_INSTANCED) ? (8*(3+1)) : (8);

		if (expectedGenerated == primitivesGenerated)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong result for GL_PRIMITIVES_GENERATED");
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Got unexpected result for GL_PRIMITIVES_GENERATED. Expected " << expectedGenerated << ", got " << primitivesGenerated
				<< tcu::TestLog::EndMessage;
		}
	}

	return STOP;
}